

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

JavascriptRegExp *
Js::JavascriptRegExp::ToRegExp(Var var,PCWSTR varName,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  JavascriptRegExp *pJVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  undefined4 extraout_var;
  Type TVar8;
  int local_3c;
  ScriptContext *pSStack_38;
  TypeId remoteTypeId;
  
  pSStack_38 = scriptContext;
  bVar2 = VarIs<Js::JavascriptRegExp>(var);
  if (bVar2) {
    pJVar5 = UnsafeVarTo<Js::JavascriptRegExp>(var);
  }
  else {
    pJVar5 = (JavascriptRegExp *)0x0;
  }
  if (pJVar5 != (JavascriptRegExp *)0x0) {
    return pJVar5;
  }
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00d14156;
    *puVar6 = 0;
  }
  if (((ulong)var & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)var & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d14156;
    *puVar6 = 0;
  }
  TVar8 = TypeIds_FirstNumberType;
  if ((((ulong)var & 0xffff000000000000) != 0x1000000000000) &&
     (TVar8 = TypeIds_Number, (ulong)var >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(var);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00d14156;
      *puVar6 = 0;
    }
    TVar8 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar3 = RecyclableObject::IsExternal(pRVar7), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00d14156:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  if (TVar8 == TypeIds_HostDispatch) {
    local_3c = 0x58;
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(var);
    iVar4 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x54])(pRVar7,&local_3c);
    if (local_3c == 0x23 && iVar4 != 0) {
      iVar4 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x56])(pRVar7);
      return (JavascriptRegExp *)CONCAT44(extraout_var,iVar4);
    }
  }
  JavascriptError::ThrowTypeError(pSStack_38,-0x7ff5ec38,varName);
}

Assistant:

JavascriptRegExp* JavascriptRegExp::ToRegExp(Var var, PCWSTR varName, ScriptContext* scriptContext)
    {
        JavascriptRegExp * regExp = JavascriptOperators::TryFromVar<JavascriptRegExp>(var);
        if (regExp)
        {
            return regExp;
        }

        if (JavascriptOperators::GetTypeId(var) == TypeIds_HostDispatch)
        {
            TypeId remoteTypeId = TypeIds_Limit;
            RecyclableObject* reclObj = UnsafeVarTo<RecyclableObject>(var);
            if (reclObj->GetRemoteTypeId(&remoteTypeId) && remoteTypeId == TypeIds_RegEx)
            {
                return static_cast<JavascriptRegExp *>(reclObj->GetRemoteObject());
            }
        }

        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedRegExp, varName);
    }